

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O3

int __thiscall
ICM::DefFunc::Calc::Add<17UL>::sign
          (Add<17UL> *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  InitList local_48;
  TypeObject local_38;
  TypeObject local_20;
  
  local_48._M_array = &local_20;
  local_20.type = T_List;
  local_20.sign = (Signature *)0x0;
  local_20.functableunit = (FuncTableUnit *)0x0;
  local_48._M_len = 1;
  local_38.type = T_List;
  local_38.sign = (Signature *)0x0;
  local_38.functableunit = (FuncTableUnit *)0x0;
  Function::Signature::Signature((Signature *)this,&local_48,&local_38,true);
  return (int)this;
}

Assistant:

S sign() const {
					DefaultType t = (DefaultType)_TU;
					return S({ t }, t, true); // T* -> T
				}